

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1089::run(TestCase1089 *this)

{
  undefined1 *puVar1;
  PointerBuilder builder_00;
  PointerBuilder builder_01;
  PointerBuilder builder_02;
  Builder reader;
  Builder root_00;
  Builder reader_00;
  Builder reader_01;
  Builder reader_02;
  Builder root_01;
  Builder reader_03;
  Builder reader_04;
  Builder reader_05;
  Builder root_02;
  Builder reader_06;
  Builder reader_07;
  Builder reader_08;
  Builder reader_09;
  Builder root_03;
  Builder reader_10;
  Builder reader_11;
  Builder reader_12;
  Builder reader_13;
  Builder reader_14;
  Builder root_04;
  Builder reader_15;
  Builder reader_16;
  Builder root_05;
  Builder reader_17;
  Builder reader_18;
  Builder reader_19;
  Builder reader_20;
  Builder reader_21;
  Builder reader_22;
  Builder root_06;
  Builder reader_23;
  Builder reader_24;
  Builder reader_25;
  Builder reader_26;
  Builder reader_27;
  Builder reader_28;
  Builder reader_29;
  Builder reader_30;
  Reader reader_31;
  Reader reader_32;
  Reader reader_33;
  Reader reader_34;
  Reader reader_35;
  Reader reader_36;
  Reader reader_37;
  Reader reader_38;
  Reader reader_39;
  Reader reader_40;
  Reader reader_41;
  Reader reader_42;
  Reader reader_43;
  Reader reader_44;
  Reader reader_45;
  undefined4 uVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  ulong uVar6;
  long lVar7;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  Reader value_05;
  initializer_list<capnp::Void> expected;
  initializer_list<long> expectedData;
  ArrayPtr<const_bool> value_06;
  initializer_list<bool> expected_00;
  initializer_list<bool> expected_01;
  initializer_list<capnp::Void> expected_02;
  initializer_list<unsigned_char> expected_03;
  initializer_list<unsigned_char> expected_04;
  initializer_list<long> expectedData_00;
  initializer_list<unsigned_char> expected_05;
  initializer_list<capnp::Void> expected_06;
  initializer_list<unsigned_char> expected_07;
  initializer_list<unsigned_short> expected_08;
  initializer_list<unsigned_short> expected_09;
  initializer_list<long> expectedData_01;
  initializer_list<unsigned_short> expected_10;
  initializer_list<capnp::Void> expected_11;
  initializer_list<unsigned_char> expected_12;
  initializer_list<unsigned_short> expected_13;
  initializer_list<unsigned_int> expected_14;
  initializer_list<unsigned_int> expected_15;
  initializer_list<long> expectedData_02;
  initializer_list<unsigned_int> expected_16;
  initializer_list<capnp::Void> expected_17;
  initializer_list<unsigned_char> expected_18;
  initializer_list<unsigned_short> expected_19;
  initializer_list<unsigned_int> expected_20;
  initializer_list<unsigned_long> expected_21;
  initializer_list<unsigned_long> expected_22;
  initializer_list<long> expectedData_03;
  initializer_list<unsigned_long> expected_23;
  ArrayPtr<const_capnp::Text::Reader> value_07;
  initializer_list<capnp::Void> expected_24;
  initializer_list<capnp::Text::Reader> expected_25;
  initializer_list<capnp::Text::Reader> expected_26;
  initializer_list<long> expectedData_04;
  initializer_list<capnp::Text::Reader> expected_27;
  initializer_list<capnp::Void> expected_28;
  initializer_list<unsigned_char> expected_29;
  initializer_list<unsigned_short> expected_30;
  initializer_list<unsigned_int> expected_31;
  initializer_list<unsigned_long> expected_32;
  initializer_list<capnp::Text::Reader> expected_33;
  initializer_list<long> expectedData_05;
  initializer_list<long> expectedData_06;
  initializer_list<long> expectedData_07;
  initializer_list<unsigned_short> expected_34;
  initializer_list<unsigned_short> expected_35;
  initializer_list<unsigned_char> expected_36;
  initializer_list<unsigned_short> expected_37;
  initializer_list<unsigned_int> expected_38;
  initializer_list<unsigned_long> expected_39;
  initializer_list<unsigned_short> expected_40;
  initializer_list<unsigned_int> expected_41;
  initializer_list<unsigned_long> expected_42;
  initializer_list<capnp::Text::Reader> expected_43;
  ArrayPtr<const_capnp::Text::Reader> value_08;
  initializer_list<capnp::Text::Reader> expectedPointers;
  initializer_list<capnp::Text::Reader> expectedPointers_00;
  initializer_list<capnp::Text::Reader> expectedPointers_01;
  initializer_list<capnp::Text::Reader> expectedPointers_02;
  initializer_list<capnp::Text::Reader> expectedPointers_03;
  initializer_list<capnp::Text::Reader> expectedPointers_04;
  initializer_list<capnp::Text::Reader> expectedPointers_05;
  initializer_list<capnp::Text::Reader> expectedPointers_06;
  initializer_list<capnp::Text::Reader> expectedPointers_07;
  ReaderFor<capnp::List<bool,_(capnp::Kind)0>_> orig;
  Builder root;
  Fault f;
  Builder l;
  MallocMessageBuilder builder;
  undefined1 local_838 [24];
  WirePointer *pWStack_820;
  StructDataBitCount local_818;
  StructPointerCount SStack_814;
  ElementSize EStack_812;
  undefined1 uStack_811;
  int iStack_810;
  undefined4 uStack_80c;
  StructBuilder local_800;
  StructBuilder local_7d8;
  Builder local_7a8;
  uint local_78c;
  Maybe<kj::Exception> local_788;
  ListBuilder local_620;
  ListBuilder local_5f8;
  ListBuilder local_5d0;
  ListBuilder local_5a8;
  ListBuilder local_580;
  ListBuilder local_558;
  ListBuilder local_530;
  ListBuilder local_508;
  ListBuilder local_4e0;
  ListBuilder local_4b8;
  ListBuilder local_490;
  ListBuilder local_468;
  ListBuilder local_440;
  ListBuilder local_418;
  ListBuilder local_3f0;
  ListBuilder local_3c8;
  ListBuilder local_3a0;
  ListBuilder local_378;
  ListBuilder local_350;
  ListBuilder local_328;
  ListBuilder local_300;
  ListBuilder local_2d8;
  ListBuilder local_2b0;
  ListBuilder local_288;
  ListBuilder local_260;
  ListBuilder local_238;
  ListBuilder local_210;
  ListBuilder local_1e8;
  ListBuilder local_1c0;
  ListBuilder local_198;
  ListBuilder local_170;
  ListBuilder local_148;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_838,&local_120.super_MessageBuilder);
  local_788.ptr.field_1.value.ownFile.content.size_ = local_838._16_8_;
  local_788.ptr._0_8_ = local_838._0_8_;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_838._8_8_;
  PointerBuilder::initStruct(&local_800,(PointerBuilder *)&local_788,(StructSize)0x10000);
  local_838._0_8_ = local_800.segment;
  local_838._8_8_ = local_800.capTable;
  local_838._16_8_ = local_800.pointers;
  PointerBuilder::initList((ListBuilder *)&local_788,(PointerBuilder *)local_838,VOID,4);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  pcVar4 = (char *)0x0;
  PointerBuilder::getList(&local_148,(PointerBuilder *)&local_788,VOID,(word *)0x0);
  reader.builder.capTable = local_148.capTable;
  reader.builder.segment = local_148.segment;
  reader.builder.ptr = local_148.ptr;
  reader.builder.elementCount = local_148.elementCount;
  reader.builder.step = local_148.step;
  reader.builder.structDataSize = local_148.structDataSize;
  reader.builder.structPointerCount = local_148.structPointerCount;
  reader.builder.elementSize = local_148.elementSize;
  reader.builder._39_1_ = local_148._39_1_;
  expected._M_len = 4;
  expected._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader,expected);
  local_838._0_8_ = &PTR_run_00372860;
  local_838._8_8_ = &local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,1099,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  local_838._0_8_ = &PTR_run_00372890;
  local_838._8_8_ = &local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[115]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x44c,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
               ,(char (*) [115])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr"
              );
  }
  local_838._0_8_ = &PTR_run_003728c0;
  local_838._8_8_ = &local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x44d,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
              );
  }
  local_838._0_8_ = &PTR_run_003728f0;
  local_838._8_8_ = &local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x44e,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  local_838._0_8_ = &PTR_run_00372920;
  local_838._8_8_ = &local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x44f,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  local_838._0_8_ = &PTR_run_00372950;
  local_838._8_8_ = &local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x450,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  local_838._16_8_ = (WirePointer *)0x0;
  pWStack_820 = (WirePointer *)0x0;
  local_838._0_8_ = (SegmentBuilder *)0x0;
  local_838._8_8_ = (CapTableReader *)0x0;
  local_788.ptr._0_8_ = "";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1;
  local_788.ptr.field_1.value.ownFile.content.size_ = (long)"\n\n" + 2;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x1;
  local_788.ptr.field_1.value.file = "";
  local_788.ptr.field_1._32_8_ = 1;
  local_788.ptr.field_1.value.description.content.ptr = "";
  local_788.ptr.field_1.value.description.content.size_ = 1;
  root_00._builder.capTable = local_800.capTable;
  root_00._builder.segment = local_800.segment;
  root_00._builder.data = local_800.data;
  root_00._builder.pointers = local_800.pointers;
  root_00._builder.dataSize = local_800.dataSize;
  root_00._builder.pointerCount = local_800.pointerCount;
  root_00._builder._38_2_ = local_800._38_2_;
  expectedData._M_len = 4;
  expectedData._M_array = (iterator)local_838;
  expectedPointers._M_len = (size_type)pcVar4;
  expectedPointers._M_array = (iterator)&local_788;
  checkUpgradedList(root_00,expectedData,expectedPointers);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  local_838._0_4_ = 0x1010001;
  builder_00.capTable = local_800.capTable;
  builder_00.segment = local_800.segment;
  builder_00.pointer = local_800.pointers;
  value_06.size_ = 4;
  value_06.ptr = (bool *)local_838;
  PointerHelpers<capnp::List<bool,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value_06);
  StructBuilder::asReader(&local_800);
  if (local_788.ptr.field_1._28_2_ == 0) {
    uVar2 = 0x7fffffff;
    local_7d8.capTable = (CapTableBuilder *)0x0;
    local_7d8.data = (ArrayDisposer *)0x0;
    local_7d8.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_7d8.capTable = (CapTableBuilder *)local_788.ptr.field_1.value.ownFile.content.ptr;
    local_7d8.data = local_788.ptr.field_1.value.ownFile.content.disposer;
    local_7d8.segment = (SegmentBuilder *)local_788.ptr._0_8_;
    uVar2 = local_788.ptr.field_1.value.line;
  }
  local_7d8.pointers = (WirePointer *)CONCAT44(local_7d8.pointers._4_4_,uVar2);
  PointerReader::getList((ListReader *)local_838,(PointerReader *)&local_7d8,BIT,(word *)0x0);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372980;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x458,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Void>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Void>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_170,(PointerBuilder *)&local_788,BIT,(word *)0x0);
  local_788.ptr._0_4_ = 0x1010001;
  reader_00.builder.capTable = local_170.capTable;
  reader_00.builder.segment = local_170.segment;
  reader_00.builder.ptr = local_170.ptr;
  reader_00.builder.elementCount = local_170.elementCount;
  reader_00.builder.step = local_170.step;
  reader_00.builder.structDataSize = local_170.structDataSize;
  reader_00.builder.structPointerCount = local_170.structPointerCount;
  reader_00.builder.elementSize = local_170.elementSize;
  reader_00.builder._39_1_ = local_170._39_1_;
  expected_00._M_len = 4;
  expected_00._M_array = (iterator)&local_788;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
            (reader_00,expected_00);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_003729b0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[115]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45a,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
               ,(char (*) [115])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_003729e0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45b,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372a10;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45c,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372a40;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45d,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372a70;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45e,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_4_ = 0x1010001;
  reader_31.reader.structPointerCount = SStack_814;
  reader_31.reader.structDataSize = local_818;
  reader_31.reader.elementSize = EStack_812;
  reader_31.reader._39_1_ = uStack_811;
  reader_31.reader._44_4_ = uStack_80c;
  reader_31.reader.nestingLimit = iStack_810;
  reader_31.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_31.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_31.reader.ptr = (byte *)local_838._16_8_;
  reader_31.reader._24_8_ = pWStack_820;
  expected_01._M_len = 4;
  expected_01._M_array = (iterator)&local_788;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Reader,_capnp::List<bool,_(capnp::Kind)0>_>
            (reader_31,expected_01);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372aa0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[128]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x463,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<test::TestNewVersion>>(); }) != nullptr\""
               ,(char (*) [128])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<test::TestNewVersion>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)CONCAT44(local_7d8.segment._4_4_,0x44332312);
  local_838._0_8_ = local_800.segment;
  local_838._8_8_ = local_800.capTable;
  local_838._16_8_ = local_800.pointers;
  PointerBuilder::initList((ListBuilder *)&local_788,(PointerBuilder *)local_838,BYTE,4);
  uVar6 = 0;
  lVar7 = 0;
  do {
    puVar1 = (undefined1 *)((long)&local_7d8.segment + lVar7);
    lVar7 = lVar7 + 1;
    *(undefined1 *)(local_788.ptr.field_1.value.ownFile.content.size_ + (uVar6 >> 3)) = *puVar1;
    uVar6 = uVar6 + ((ulong)local_788.ptr.field_1.value.ownFile.content.disposer >> 0x20);
  } while (lVar7 != 4);
  StructBuilder::asReader(&local_800);
  if (local_788.ptr.field_1._28_2_ == 0) {
    uVar2 = 0x7fffffff;
    local_7d8.capTable = (CapTableBuilder *)0x0;
    local_7d8.data = (ArrayDisposer *)0x0;
    local_7d8.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_7d8.capTable = (CapTableBuilder *)local_788.ptr.field_1.value.ownFile.content.ptr;
    local_7d8.data = local_788.ptr.field_1.value.ownFile.content.disposer;
    local_7d8.segment = (SegmentBuilder *)local_788.ptr._0_8_;
    uVar2 = local_788.ptr.field_1.value.line;
  }
  local_7d8.pointers = (WirePointer *)CONCAT44(local_7d8.pointers._4_4_,uVar2);
  PointerReader::getList((ListReader *)local_838,(PointerReader *)&local_7d8,BYTE,(word *)0x0);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_198,(PointerBuilder *)&local_788,VOID,(word *)0x0);
  reader_01.builder.capTable = local_198.capTable;
  reader_01.builder.segment = local_198.segment;
  reader_01.builder.ptr = local_198.ptr;
  reader_01.builder.elementCount = local_198.elementCount;
  reader_01.builder.step = local_198.step;
  reader_01.builder.structDataSize = local_198.structDataSize;
  reader_01.builder.structPointerCount = local_198.structPointerCount;
  reader_01.builder.elementSize = local_198.elementSize;
  reader_01.builder._39_1_ = local_198._39_1_;
  expected_02._M_len = 4;
  expected_02._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_01,expected_02);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372ad0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x46c,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  pcVar4 = (char *)0x0;
  PointerBuilder::getList(&local_1c0,(PointerBuilder *)&local_788,BYTE,(word *)0x0);
  local_788.ptr._0_4_ = 0x44332312;
  reader_02.builder.capTable = local_1c0.capTable;
  reader_02.builder.segment = local_1c0.segment;
  reader_02.builder.ptr = local_1c0.ptr;
  reader_02.builder.elementCount = local_1c0.elementCount;
  reader_02.builder.step = local_1c0.step;
  reader_02.builder.structDataSize = local_1c0.structDataSize;
  reader_02.builder.structPointerCount = local_1c0.structPointerCount;
  reader_02.builder.elementSize = local_1c0.elementSize;
  reader_02.builder._39_1_ = local_1c0._39_1_;
  expected_03._M_len = 4;
  expected_03._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_02,expected_03);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372b00;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x46e,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372b30;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x46f,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372b60;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x470,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372b90;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x471,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_4_ = 0x44332312;
  reader_32.reader.structPointerCount = SStack_814;
  reader_32.reader.structDataSize = local_818;
  reader_32.reader.elementSize = EStack_812;
  reader_32.reader._39_1_ = uStack_811;
  reader_32.reader._44_4_ = uStack_80c;
  reader_32.reader.nestingLimit = iStack_810;
  reader_32.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_32.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_32.reader.ptr = (byte *)local_838._16_8_;
  reader_32.reader._24_8_ = pWStack_820;
  expected_04._M_len = 4;
  expected_04._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_32,expected_04);
  local_7d8.data = (void *)0x33;
  local_7d8.pointers = (WirePointer *)0x44;
  local_7d8.segment = (SegmentBuilder *)0x12;
  local_7d8.capTable = (CapTableBuilder *)0x23;
  local_788.ptr._0_8_ = "";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1;
  local_788.ptr.field_1.value.ownFile.content.size_ = (long)"\n\n" + 2;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x1;
  local_788.ptr.field_1.value.file = "";
  local_788.ptr.field_1._32_8_ = 1;
  local_788.ptr.field_1.value.description.content.ptr = "";
  local_788.ptr.field_1.value.description.content.size_ = 1;
  root_01._builder.capTable = local_800.capTable;
  root_01._builder.segment = local_800.segment;
  root_01._builder.data = local_800.data;
  root_01._builder.pointers = local_800.pointers;
  root_01._builder.dataSize = local_800.dataSize;
  root_01._builder.pointerCount = local_800.pointerCount;
  root_01._builder._38_2_ = local_800._38_2_;
  expectedData_00._M_len = 4;
  expectedData_00._M_array = (iterator)&local_7d8;
  expectedPointers_00._M_len = (size_type)pcVar4;
  expectedPointers_00._M_array = (iterator)&local_788;
  checkUpgradedList(root_01,expectedData_00,expectedPointers_00);
  local_788.ptr._0_8_ = local_788.ptr._0_8_ & 0xffffffff00000000;
  reader_33.reader.structPointerCount = SStack_814;
  reader_33.reader.structDataSize = local_818;
  reader_33.reader.elementSize = EStack_812;
  reader_33.reader._39_1_ = uStack_811;
  reader_33.reader._44_4_ = uStack_80c;
  reader_33.reader.nestingLimit = iStack_810;
  reader_33.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_33.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_33.reader.ptr = (byte *)local_838._16_8_;
  reader_33.reader._24_8_ = pWStack_820;
  expected_05._M_len = 4;
  expected_05._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_33,expected_05);
  local_7d8.segment = (SegmentBuilder *)0xcd44ab3378235612;
  local_838._0_8_ = local_800.segment;
  local_838._8_8_ = local_800.capTable;
  local_838._16_8_ = local_800.pointers;
  PointerBuilder::initList((ListBuilder *)&local_788,(PointerBuilder *)local_838,TWO_BYTES,4);
  uVar6 = 0;
  lVar7 = 0;
  do {
    *(undefined2 *)(local_788.ptr.field_1.value.ownFile.content.size_ + (uVar6 >> 3)) =
         *(undefined2 *)((long)&local_7d8.segment + lVar7);
    lVar7 = lVar7 + 2;
    uVar6 = uVar6 + ((ulong)local_788.ptr.field_1.value.ownFile.content.disposer >> 0x20);
  } while (lVar7 != 8);
  StructBuilder::asReader(&local_800);
  if (local_788.ptr.field_1._28_2_ == 0) {
    uVar2 = 0x7fffffff;
    local_7d8.capTable = (CapTableBuilder *)0x0;
    local_7d8.data = (ArrayDisposer *)0x0;
    local_7d8.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_7d8.capTable = (CapTableBuilder *)local_788.ptr.field_1.value.ownFile.content.ptr;
    local_7d8.data = local_788.ptr.field_1.value.ownFile.content.disposer;
    local_7d8.segment = (SegmentBuilder *)local_788.ptr._0_8_;
    uVar2 = local_788.ptr.field_1.value.line;
  }
  local_7d8.pointers = (WirePointer *)CONCAT44(local_7d8.pointers._4_4_,uVar2);
  PointerReader::getList((ListReader *)local_838,(PointerReader *)&local_7d8,TWO_BYTES,(word *)0x0);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_1e8,(PointerBuilder *)&local_788,VOID,(word *)0x0);
  reader_03.builder.capTable = local_1e8.capTable;
  reader_03.builder.segment = local_1e8.segment;
  reader_03.builder.ptr = local_1e8.ptr;
  reader_03.builder.elementCount = local_1e8.elementCount;
  reader_03.builder.step = local_1e8.step;
  reader_03.builder.structDataSize = local_1e8.structDataSize;
  reader_03.builder.structPointerCount = local_1e8.structPointerCount;
  reader_03.builder.elementSize = local_1e8.elementSize;
  reader_03.builder._39_1_ = local_1e8._39_1_;
  expected_06._M_len = 4;
  expected_06._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_03,expected_06);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372bc0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x47e,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_210,(PointerBuilder *)&local_788,BYTE,(word *)0x0);
  local_788.ptr._0_4_ = 0x44332312;
  reader_04.builder.capTable = local_210.capTable;
  reader_04.builder.segment = local_210.segment;
  reader_04.builder.ptr = local_210.ptr;
  reader_04.builder.elementCount = local_210.elementCount;
  reader_04.builder.step = local_210.step;
  reader_04.builder.structDataSize = local_210.structDataSize;
  reader_04.builder.structPointerCount = local_210.structPointerCount;
  reader_04.builder.elementSize = local_210.elementSize;
  reader_04.builder._39_1_ = local_210._39_1_;
  expected_07._M_len = 4;
  expected_07._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_04,expected_07);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  pcVar4 = (char *)0x0;
  PointerBuilder::getList(&local_238,(PointerBuilder *)&local_788,TWO_BYTES,(word *)0x0);
  local_788.ptr._0_8_ = (SegmentBuilder *)0xcd44ab3378235612;
  reader_05.builder.capTable = local_238.capTable;
  reader_05.builder.segment = local_238.segment;
  reader_05.builder.ptr = local_238.ptr;
  reader_05.builder.elementCount = local_238.elementCount;
  reader_05.builder.step = local_238.step;
  reader_05.builder.structDataSize = local_238.structDataSize;
  reader_05.builder.structPointerCount = local_238.structPointerCount;
  reader_05.builder.elementSize = local_238.elementSize;
  reader_05.builder._39_1_ = local_238._39_1_;
  expected_08._M_len = 4;
  expected_08._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_05,expected_08);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372bf0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x481,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372c20;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x482,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372c50;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x483,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = (SegmentBuilder *)0xcd44ab3378235612;
  reader_34.reader.structPointerCount = SStack_814;
  reader_34.reader.structDataSize = local_818;
  reader_34.reader.elementSize = EStack_812;
  reader_34.reader._39_1_ = uStack_811;
  reader_34.reader._44_4_ = uStack_80c;
  reader_34.reader.nestingLimit = iStack_810;
  reader_34.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_34.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_34.reader.ptr = (byte *)local_838._16_8_;
  reader_34.reader._24_8_ = pWStack_820;
  expected_09._M_len = 4;
  expected_09._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_34,expected_09);
  local_7d8.data = (void *)0xab33;
  local_7d8.pointers = (WirePointer *)0xcd44;
  local_7d8.segment = (SegmentBuilder *)0x5612;
  local_7d8.capTable = (CapTableBuilder *)0x7823;
  local_788.ptr._0_8_ = "";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1;
  local_788.ptr.field_1.value.ownFile.content.size_ = (long)"\n\n" + 2;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x1;
  local_788.ptr.field_1.value.file = "";
  local_788.ptr.field_1._32_8_ = 1;
  local_788.ptr.field_1.value.description.content.ptr = "";
  local_788.ptr.field_1.value.description.content.size_ = 1;
  root_02._builder.capTable = local_800.capTable;
  root_02._builder.segment = local_800.segment;
  root_02._builder.data = local_800.data;
  root_02._builder.pointers = local_800.pointers;
  root_02._builder.dataSize = local_800.dataSize;
  root_02._builder.pointerCount = local_800.pointerCount;
  root_02._builder._38_2_ = local_800._38_2_;
  expectedData_01._M_len = 4;
  expectedData_01._M_array = (iterator)&local_7d8;
  expectedPointers_01._M_len = (size_type)pcVar4;
  expectedPointers_01._M_array = (iterator)&local_788;
  checkUpgradedList(root_02,expectedData_01,expectedPointers_01);
  local_788.ptr._0_8_ = (SegmentBuilder *)0x0;
  reader_35.reader.structPointerCount = SStack_814;
  reader_35.reader.structDataSize = local_818;
  reader_35.reader.elementSize = EStack_812;
  reader_35.reader._39_1_ = uStack_811;
  reader_35.reader._44_4_ = uStack_80c;
  reader_35.reader.nestingLimit = iStack_810;
  reader_35.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_35.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_35.reader.ptr = (byte *)local_838._16_8_;
  reader_35.reader._24_8_ = pWStack_820;
  expected_10._M_len = 4;
  expected_10._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_35,expected_10);
  local_7d8.segment = (SegmentBuilder *)0x2934782317595612;
  local_7d8.capTable = (CapTableBuilder *)0x1a39cd455923ab32;
  local_838._0_8_ = local_800.segment;
  local_838._8_8_ = local_800.capTable;
  local_838._16_8_ = local_800.pointers;
  PointerBuilder::initList((ListBuilder *)&local_788,(PointerBuilder *)local_838,FOUR_BYTES,4);
  uVar6 = 0;
  lVar7 = 0;
  do {
    *(undefined4 *)(local_788.ptr.field_1.value.ownFile.content.size_ + (uVar6 >> 3)) =
         *(undefined4 *)((long)&local_7d8.segment + lVar7);
    lVar7 = lVar7 + 4;
    uVar6 = uVar6 + ((ulong)local_788.ptr.field_1.value.ownFile.content.disposer >> 0x20);
  } while (lVar7 != 0x10);
  StructBuilder::asReader(&local_800);
  if (local_788.ptr.field_1._28_2_ == 0) {
    uVar2 = 0x7fffffff;
    local_7d8.capTable = (CapTableBuilder *)0x0;
    local_7d8.data = (ArrayDisposer *)0x0;
    local_7d8.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_7d8.capTable = (CapTableBuilder *)local_788.ptr.field_1.value.ownFile.content.ptr;
    local_7d8.data = local_788.ptr.field_1.value.ownFile.content.disposer;
    local_7d8.segment = (SegmentBuilder *)local_788.ptr._0_8_;
    uVar2 = local_788.ptr.field_1.value.line;
  }
  local_7d8.pointers = (WirePointer *)CONCAT44(local_7d8.pointers._4_4_,uVar2);
  PointerReader::getList((ListReader *)local_838,(PointerReader *)&local_7d8,FOUR_BYTES,(word *)0x0)
  ;
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_260,(PointerBuilder *)&local_788,VOID,(word *)0x0);
  reader_06.builder.capTable = local_260.capTable;
  reader_06.builder.segment = local_260.segment;
  reader_06.builder.ptr = local_260.ptr;
  reader_06.builder.elementCount = local_260.elementCount;
  reader_06.builder.step = local_260.step;
  reader_06.builder.structDataSize = local_260.structDataSize;
  reader_06.builder.structPointerCount = local_260.structPointerCount;
  reader_06.builder.elementSize = local_260.elementSize;
  reader_06.builder._39_1_ = local_260._39_1_;
  expected_11._M_len = 4;
  expected_11._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_06,expected_11);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372c80;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x490,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_288,(PointerBuilder *)&local_788,BYTE,(word *)0x0);
  local_788.ptr._0_4_ = 0x45322312;
  reader_07.builder.capTable = local_288.capTable;
  reader_07.builder.segment = local_288.segment;
  reader_07.builder.ptr = local_288.ptr;
  reader_07.builder.elementCount = local_288.elementCount;
  reader_07.builder.step = local_288.step;
  reader_07.builder.structDataSize = local_288.structDataSize;
  reader_07.builder.structPointerCount = local_288.structPointerCount;
  reader_07.builder.elementSize = local_288.elementSize;
  reader_07.builder._39_1_ = local_288._39_1_;
  expected_12._M_len = 4;
  expected_12._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_07,expected_12);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_2b0,(PointerBuilder *)&local_788,TWO_BYTES,(word *)0x0);
  local_788.ptr._0_8_ = (SegmentBuilder *)0xcd45ab3278235612;
  reader_08.builder.capTable = local_2b0.capTable;
  reader_08.builder.segment = local_2b0.segment;
  reader_08.builder.ptr = local_2b0.ptr;
  reader_08.builder.elementCount = local_2b0.elementCount;
  reader_08.builder.step = local_2b0.step;
  reader_08.builder.structDataSize = local_2b0.structDataSize;
  reader_08.builder.structPointerCount = local_2b0.structPointerCount;
  reader_08.builder.elementSize = local_2b0.elementSize;
  reader_08.builder._39_1_ = local_2b0._39_1_;
  expected_13._M_len = 4;
  expected_13._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_08,expected_13);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  pcVar4 = (char *)0x0;
  PointerBuilder::getList(&local_2d8,(PointerBuilder *)&local_788,FOUR_BYTES,(word *)0x0);
  local_788.ptr._0_8_ = (SegmentBuilder *)0x2934782317595612;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1a39cd455923ab32;
  reader_09.builder.capTable = local_2d8.capTable;
  reader_09.builder.segment = local_2d8.segment;
  reader_09.builder.ptr = local_2d8.ptr;
  reader_09.builder.elementCount = local_2d8.elementCount;
  reader_09.builder.step = local_2d8.step;
  reader_09.builder.structDataSize = local_2d8.structDataSize;
  reader_09.builder.structPointerCount = local_2d8.structPointerCount;
  reader_09.builder.elementSize = local_2d8.elementSize;
  reader_09.builder._39_1_ = local_2d8._39_1_;
  expected_14._M_len = 4;
  expected_14._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_09,expected_14);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372cb0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x494,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372ce0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x495,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = (SegmentBuilder *)0x2934782317595612;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1a39cd455923ab32;
  reader_36.reader.structPointerCount = SStack_814;
  reader_36.reader.structDataSize = local_818;
  reader_36.reader.elementSize = EStack_812;
  reader_36.reader._39_1_ = uStack_811;
  reader_36.reader._44_4_ = uStack_80c;
  reader_36.reader.nestingLimit = iStack_810;
  reader_36.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_36.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_36.reader.ptr = (byte *)local_838._16_8_;
  reader_36.reader._24_8_ = pWStack_820;
  expected_15._M_len = 4;
  expected_15._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_36,expected_15);
  local_7d8.data = (void *)0x5923ab32;
  local_7d8.pointers = (WirePointer *)0x1a39cd45;
  local_7d8.segment = (SegmentBuilder *)0x17595612;
  local_7d8.capTable = (CapTableBuilder *)0x29347823;
  local_788.ptr._0_8_ = "";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1;
  local_788.ptr.field_1.value.ownFile.content.size_ = (long)"\n\n" + 2;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x1;
  local_788.ptr.field_1.value.file = "";
  local_788.ptr.field_1._32_8_ = 1;
  local_788.ptr.field_1.value.description.content.ptr = "";
  local_788.ptr.field_1.value.description.content.size_ = 1;
  root_03._builder.capTable = local_800.capTable;
  root_03._builder.segment = local_800.segment;
  root_03._builder.data = local_800.data;
  root_03._builder.pointers = local_800.pointers;
  root_03._builder.dataSize = local_800.dataSize;
  root_03._builder.pointerCount = local_800.pointerCount;
  root_03._builder._38_2_ = local_800._38_2_;
  expectedData_02._M_len = 4;
  expectedData_02._M_array = (iterator)&local_7d8;
  expectedPointers_02._M_len = (size_type)pcVar4;
  expectedPointers_02._M_array = (iterator)&local_788;
  checkUpgradedList(root_03,expectedData_02,expectedPointers_02);
  local_788.ptr._0_8_ = (SegmentBuilder *)0x0;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
  reader_37.reader.structPointerCount = SStack_814;
  reader_37.reader.structDataSize = local_818;
  reader_37.reader.elementSize = EStack_812;
  reader_37.reader._39_1_ = uStack_811;
  reader_37.reader._44_4_ = uStack_80c;
  reader_37.reader.nestingLimit = iStack_810;
  reader_37.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_37.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_37.reader.ptr = (byte *)local_838._16_8_;
  reader_37.reader._24_8_ = pWStack_820;
  expected_16._M_len = 4;
  expected_16._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_37,expected_16);
  local_7d8.segment = (SegmentBuilder *)0x1234abcd8735fe21;
  local_7d8.capTable = (CapTableBuilder *)0x7173bc0e1923af36;
  local_838._0_8_ = local_800.segment;
  local_838._8_8_ = local_800.capTable;
  local_838._16_8_ = local_800.pointers;
  PointerBuilder::initList((ListBuilder *)&local_788,(PointerBuilder *)local_838,EIGHT_BYTES,2);
  uVar6 = 0;
  lVar7 = 0;
  do {
    *(undefined8 *)(local_788.ptr.field_1.value.ownFile.content.size_ + (uVar6 >> 3)) =
         *(undefined8 *)((long)&local_7d8.segment + lVar7);
    lVar7 = lVar7 + 8;
    uVar6 = uVar6 + ((ulong)local_788.ptr.field_1.value.ownFile.content.disposer >> 0x20);
  } while (lVar7 != 0x10);
  StructBuilder::asReader(&local_800);
  if (local_788.ptr.field_1._28_2_ == 0) {
    uVar2 = 0x7fffffff;
    local_7d8.capTable = (CapTableBuilder *)0x0;
    local_7d8.data = (ArrayDisposer *)0x0;
    local_7d8.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_7d8.capTable = (CapTableBuilder *)local_788.ptr.field_1.value.ownFile.content.ptr;
    local_7d8.data = local_788.ptr.field_1.value.ownFile.content.disposer;
    local_7d8.segment = (SegmentBuilder *)local_788.ptr._0_8_;
    uVar2 = local_788.ptr.field_1.value.line;
  }
  local_7d8.pointers = (WirePointer *)CONCAT44(local_7d8.pointers._4_4_,uVar2);
  PointerReader::getList
            ((ListReader *)local_838,(PointerReader *)&local_7d8,EIGHT_BYTES,(word *)0x0);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_300,(PointerBuilder *)&local_788,VOID,(word *)0x0);
  reader_10.builder.capTable = local_300.capTable;
  reader_10.builder.segment = local_300.segment;
  reader_10.builder.ptr = local_300.ptr;
  reader_10.builder.elementCount = local_300.elementCount;
  reader_10.builder.step = local_300.step;
  reader_10.builder.structDataSize = local_300.structDataSize;
  reader_10.builder.structPointerCount = local_300.structPointerCount;
  reader_10.builder.elementSize = local_300.elementSize;
  reader_10.builder._39_1_ = local_300._39_1_;
  expected_17._M_len = 2;
  expected_17._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_10,expected_17);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372d10;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4a2,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_328,(PointerBuilder *)&local_788,BYTE,(word *)0x0);
  local_788.ptr._0_2_ = 0x3621;
  reader_11.builder.capTable = local_328.capTable;
  reader_11.builder.segment = local_328.segment;
  reader_11.builder.ptr = local_328.ptr;
  reader_11.builder.elementCount = local_328.elementCount;
  reader_11.builder.step = local_328.step;
  reader_11.builder.structDataSize = local_328.structDataSize;
  reader_11.builder.structPointerCount = local_328.structPointerCount;
  reader_11.builder.elementSize = local_328.elementSize;
  reader_11.builder._39_1_ = local_328._39_1_;
  expected_18._M_len = 2;
  expected_18._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_11,expected_18);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_350,(PointerBuilder *)&local_788,TWO_BYTES,(word *)0x0);
  local_788.ptr._0_4_ = 0xaf36fe21;
  reader_12.builder.capTable = local_350.capTable;
  reader_12.builder.segment = local_350.segment;
  reader_12.builder.ptr = local_350.ptr;
  reader_12.builder.elementCount = local_350.elementCount;
  reader_12.builder.step = local_350.step;
  reader_12.builder.structDataSize = local_350.structDataSize;
  reader_12.builder.structPointerCount = local_350.structPointerCount;
  reader_12.builder.elementSize = local_350.elementSize;
  reader_12.builder._39_1_ = local_350._39_1_;
  expected_19._M_len = 2;
  expected_19._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_12,expected_19);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_378,(PointerBuilder *)&local_788,FOUR_BYTES,(word *)0x0);
  local_788.ptr._0_8_ = (SegmentBuilder *)0x1923af368735fe21;
  reader_13.builder.capTable = local_378.capTable;
  reader_13.builder.segment = local_378.segment;
  reader_13.builder.ptr = local_378.ptr;
  reader_13.builder.elementCount = local_378.elementCount;
  reader_13.builder.step = local_378.step;
  reader_13.builder.structDataSize = local_378.structDataSize;
  reader_13.builder.structPointerCount = local_378.structPointerCount;
  reader_13.builder.elementSize = local_378.elementSize;
  reader_13.builder._39_1_ = local_378._39_1_;
  expected_20._M_len = 2;
  expected_20._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_13,expected_20);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  pcVar4 = (char *)0x0;
  PointerBuilder::getList(&local_3a0,(PointerBuilder *)&local_788,EIGHT_BYTES,(word *)0x0);
  local_788.ptr._0_8_ = (SegmentBuilder *)0x1234abcd8735fe21;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x7173bc0e1923af36;
  reader_14.builder.capTable = local_3a0.capTable;
  reader_14.builder.segment = local_3a0.segment;
  reader_14.builder.ptr = local_3a0.ptr;
  reader_14.builder.elementCount = local_3a0.elementCount;
  reader_14.builder.step = local_3a0.step;
  reader_14.builder.structDataSize = local_3a0.structDataSize;
  reader_14.builder.structPointerCount = local_3a0.structPointerCount;
  reader_14.builder.elementSize = local_3a0.elementSize;
  reader_14.builder._39_1_ = local_3a0._39_1_;
  expected_21._M_len = 2;
  expected_21._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_14,expected_21);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372d40;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4a7,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = (SegmentBuilder *)0x1234abcd8735fe21;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x7173bc0e1923af36;
  reader_38.reader.structPointerCount = SStack_814;
  reader_38.reader.structDataSize = local_818;
  reader_38.reader.elementSize = EStack_812;
  reader_38.reader._39_1_ = uStack_811;
  reader_38.reader._44_4_ = uStack_80c;
  reader_38.reader.nestingLimit = iStack_810;
  reader_38.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_38.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_38.reader.ptr = (byte *)local_838._16_8_;
  reader_38.reader._24_8_ = pWStack_820;
  expected_22._M_len = 2;
  expected_22._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_38,expected_22);
  local_7d8.segment = (SegmentBuilder *)0x1234abcd8735fe21;
  local_7d8.capTable = (CapTableBuilder *)0x7173bc0e1923af36;
  local_788.ptr._0_8_ = "";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1;
  local_788.ptr.field_1.value.ownFile.content.size_ = (long)"\n\n" + 2;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x1;
  root_04._builder.capTable = local_800.capTable;
  root_04._builder.segment = local_800.segment;
  root_04._builder.data = local_800.data;
  root_04._builder.pointers = local_800.pointers;
  root_04._builder.dataSize = local_800.dataSize;
  root_04._builder.pointerCount = local_800.pointerCount;
  root_04._builder._38_2_ = local_800._38_2_;
  expectedData_03._M_len = 2;
  expectedData_03._M_array = (iterator)&local_7d8;
  expectedPointers_03._M_len = (size_type)pcVar4;
  expectedPointers_03._M_array = (iterator)&local_788;
  checkUpgradedList(root_04,expectedData_03,expectedPointers_03);
  local_788.ptr._0_8_ = (SegmentBuilder *)0x0;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
  reader_39.reader.structPointerCount = SStack_814;
  reader_39.reader.structDataSize = local_818;
  reader_39.reader.elementSize = EStack_812;
  reader_39.reader._39_1_ = uStack_811;
  reader_39.reader._44_4_ = uStack_80c;
  reader_39.reader.nestingLimit = iStack_810;
  reader_39.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_39.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_39.reader.ptr = (byte *)local_838._16_8_;
  reader_39.reader._24_8_ = pWStack_820;
  expected_23._M_len = 2;
  expected_23._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_39,expected_23);
  local_838._0_8_ = local_800.segment;
  local_838._8_8_ = local_800.capTable;
  local_838._16_8_ = local_800.pointers;
  local_788.ptr._0_8_ = "foo";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x4;
  local_788.ptr.field_1.value.ownFile.content.size_ =
       (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x4;
  local_788.ptr.field_1.value.file = "baz";
  local_788.ptr.field_1._32_8_ = 4;
  builder_01.capTable = local_800.capTable;
  builder_01.segment = local_800.segment;
  builder_01.pointer = local_800.pointers;
  value_07.size_ = 3;
  value_07.ptr = (Reader *)&local_788;
  PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_01,value_07)
  ;
  StructBuilder::asReader(&local_800);
  if (local_788.ptr.field_1._28_2_ == 0) {
    uVar2 = 0x7fffffff;
    local_7d8.capTable = (CapTableBuilder *)0x0;
    local_7d8.data = (ArrayDisposer *)0x0;
    local_7d8.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_7d8.capTable = (CapTableBuilder *)local_788.ptr.field_1.value.ownFile.content.ptr;
    local_7d8.data = local_788.ptr.field_1.value.ownFile.content.disposer;
    local_7d8.segment = (SegmentBuilder *)local_788.ptr._0_8_;
    uVar2 = local_788.ptr.field_1.value.line;
  }
  local_7d8.pointers = (WirePointer *)CONCAT44(local_7d8.pointers._4_4_,uVar2);
  PointerReader::getList((ListReader *)local_838,(PointerReader *)&local_7d8,POINTER,(word *)0x0);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_3c8,(PointerBuilder *)&local_788,VOID,(word *)0x0);
  reader_15.builder.capTable = local_3c8.capTable;
  reader_15.builder.segment = local_3c8.segment;
  reader_15.builder.ptr = local_3c8.ptr;
  reader_15.builder.elementCount = local_3c8.elementCount;
  reader_15.builder.step = local_3c8.step;
  reader_15.builder.structDataSize = local_3c8.structDataSize;
  reader_15.builder.structPointerCount = local_3c8.structPointerCount;
  reader_15.builder.elementSize = local_3c8.elementSize;
  reader_15.builder._39_1_ = local_3c8._39_1_;
  expected_24._M_len = 3;
  expected_24._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_15,expected_24);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372d70;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b4,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372da0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[115]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b5,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
               ,(char (*) [115])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372dd0;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b6,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372e00;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b7,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372e30;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b8,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  sVar5 = 0;
  PointerBuilder::getList(&local_3f0,(PointerBuilder *)&local_788,POINTER,(word *)0x0);
  local_788.ptr._0_8_ = "foo";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x4;
  local_788.ptr.field_1.value.ownFile.content.size_ =
       (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x4;
  local_788.ptr.field_1.value.file = "baz";
  local_788.ptr.field_1._32_8_ = 4;
  reader_16.builder.capTable = local_3f0.capTable;
  reader_16.builder.segment = local_3f0.segment;
  reader_16.builder.ptr = local_3f0.ptr;
  reader_16.builder.elementCount = local_3f0.elementCount;
  reader_16.builder.step = local_3f0.step;
  reader_16.builder.structDataSize = local_3f0.structDataSize;
  reader_16.builder.structPointerCount = local_3f0.structPointerCount;
  reader_16.builder.elementSize = local_3f0.elementSize;
  reader_16.builder._39_1_ = local_3f0._39_1_;
  expected_25._M_len = 3;
  expected_25._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_16,expected_25);
  local_788.ptr._0_8_ = "foo";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x4;
  local_788.ptr.field_1.value.ownFile.content.size_ =
       (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x4;
  local_788.ptr.field_1.value.file = "baz";
  local_788.ptr.field_1._32_8_ = 4;
  reader_40.reader.structPointerCount = SStack_814;
  reader_40.reader.structDataSize = local_818;
  reader_40.reader.elementSize = EStack_812;
  reader_40.reader._39_1_ = uStack_811;
  reader_40.reader._44_4_ = uStack_80c;
  reader_40.reader.nestingLimit = iStack_810;
  reader_40.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_40.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_40.reader.ptr = (byte *)local_838._16_8_;
  reader_40.reader._24_8_ = pWStack_820;
  expected_26._M_len = 3;
  expected_26._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_40,expected_26);
  local_7d8.segment = (SegmentBuilder *)0x0;
  local_7d8.capTable = (CapTableBuilder *)0x0;
  local_7d8.data = (void *)0x0;
  local_788.ptr._0_8_ = "foo";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x4;
  local_788.ptr.field_1.value.ownFile.content.size_ =
       (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x4;
  local_788.ptr.field_1.value.file = "baz";
  local_788.ptr.field_1._32_8_ = 4;
  root_05._builder.capTable = local_800.capTable;
  root_05._builder.segment = local_800.segment;
  root_05._builder.data = local_800.data;
  root_05._builder.pointers = local_800.pointers;
  root_05._builder.dataSize = local_800.dataSize;
  root_05._builder.pointerCount = local_800.pointerCount;
  root_05._builder._38_2_ = local_800._38_2_;
  expectedData_04._M_len = 3;
  expectedData_04._M_array = (iterator)&local_7d8;
  expectedPointers_04._M_len = sVar5;
  expectedPointers_04._M_array = (iterator)&local_788;
  checkUpgradedList(root_05,expectedData_04,expectedPointers_04);
  local_788.ptr._0_8_ = "";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1;
  local_788.ptr.field_1.value.ownFile.content.size_ = (long)"\n\n" + 2;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x1;
  local_788.ptr.field_1.value.file = "";
  local_788.ptr.field_1._32_8_ = 1;
  reader_41.reader.structPointerCount = SStack_814;
  reader_41.reader.structDataSize = local_818;
  reader_41.reader.elementSize = EStack_812;
  reader_41.reader._39_1_ = uStack_811;
  reader_41.reader._44_4_ = uStack_80c;
  reader_41.reader.nestingLimit = iStack_810;
  reader_41.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_41.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_41.reader.ptr = (byte *)local_838._16_8_;
  reader_41.reader._24_8_ = pWStack_820;
  expected_27._M_len = 3;
  expected_27._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_41,expected_27);
  local_838._0_8_ = local_800.segment;
  local_838._8_8_ = local_800.capTable;
  local_838._16_8_ = local_800.pointers;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_788,(PointerBuilder *)local_838,3,(StructSize)0x20001);
  ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,0);
  *(WirePointer *)local_838._16_8_ = (WirePointer)0x1234567890abcdef;
  ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,1);
  *(WirePointer *)local_838._16_8_ = (WirePointer)0x234567890abcdef1;
  ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,2);
  *(WirePointer *)local_838._16_8_ = (WirePointer)0x34567890abcdef12;
  ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,0);
  local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
  local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
  local_7d8.data = pWStack_820;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_7d8,value);
  ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,1);
  local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
  local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
  local_7d8.data = pWStack_820;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_7d8,value_00);
  ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,2);
  local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
  local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
  local_7d8.data = pWStack_820;
  value_01.super_StringPtr.content.size_ = 4;
  value_01.super_StringPtr.content.ptr = "baz";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_7d8,value_01);
  StructBuilder::asReader(&local_800);
  if (local_788.ptr.field_1._28_2_ == 0) {
    uVar2 = 0x7fffffff;
    local_7d8.capTable = (CapTableBuilder *)0x0;
    local_7d8.data = (ArrayDisposer *)0x0;
    local_7d8.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_7d8.capTable = (CapTableBuilder *)local_788.ptr.field_1.value.ownFile.content.ptr;
    local_7d8.data = local_788.ptr.field_1.value.ownFile.content.disposer;
    local_7d8.segment = (SegmentBuilder *)local_788.ptr._0_8_;
    uVar2 = local_788.ptr.field_1.value.line;
  }
  local_7d8.pointers = (WirePointer *)CONCAT44(local_7d8.pointers._4_4_,uVar2);
  PointerReader::getList
            ((ListReader *)local_838,(PointerReader *)&local_7d8,INLINE_COMPOSITE,(word *)0x0);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_418,(PointerBuilder *)&local_788,VOID,(word *)0x0);
  reader_17.builder.capTable = local_418.capTable;
  reader_17.builder.segment = local_418.segment;
  reader_17.builder.ptr = local_418.ptr;
  reader_17.builder.elementCount = local_418.elementCount;
  reader_17.builder.step = local_418.step;
  reader_17.builder.structDataSize = local_418.structDataSize;
  reader_17.builder.structPointerCount = local_418.structPointerCount;
  reader_17.builder.elementSize = local_418.elementSize;
  reader_17.builder._39_1_ = local_418._39_1_;
  expected_28._M_len = 3;
  expected_28._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_17,expected_28);
  local_7d8.segment = (SegmentBuilder *)&PTR_run_00372e60;
  local_7d8.capTable = (CapTableBuilder *)&local_800;
  kj::_::runCatchingExceptions(&local_788,(Runnable *)&local_7d8);
  if ((Void)local_788.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_788.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4cf,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_440,(PointerBuilder *)&local_788,BYTE,(word *)0x0);
  local_788.ptr._0_3_ = 0x12f1ef;
  reader_18.builder.capTable = local_440.capTable;
  reader_18.builder.segment = local_440.segment;
  reader_18.builder.ptr = local_440.ptr;
  reader_18.builder.elementCount = local_440.elementCount;
  reader_18.builder.step = local_440.step;
  reader_18.builder.structDataSize = local_440.structDataSize;
  reader_18.builder.structPointerCount = local_440.structPointerCount;
  reader_18.builder.elementSize = local_440.elementSize;
  reader_18.builder._39_1_ = local_440._39_1_;
  expected_29._M_len = 3;
  expected_29._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_18,expected_29);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_468,(PointerBuilder *)&local_788,TWO_BYTES,(word *)0x0);
  local_788.ptr._0_6_ = 0xef12def1cdef;
  reader_19.builder.capTable = local_468.capTable;
  reader_19.builder.segment = local_468.segment;
  reader_19.builder.ptr = local_468.ptr;
  reader_19.builder.elementCount = local_468.elementCount;
  reader_19.builder.step = local_468.step;
  reader_19.builder.structDataSize = local_468.structDataSize;
  reader_19.builder.structPointerCount = local_468.structPointerCount;
  reader_19.builder.elementSize = local_468.elementSize;
  reader_19.builder._39_1_ = local_468._39_1_;
  expected_30._M_len = 3;
  expected_30._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_19,expected_30);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_490,(PointerBuilder *)&local_788,FOUR_BYTES,(word *)0x0);
  local_788.ptr._0_8_ = (SegmentBuilder *)0xabcdef190abcdef;
  local_788.ptr.field_1._0_4_ = 0xabcdef12;
  reader_20.builder.capTable = local_490.capTable;
  reader_20.builder.segment = local_490.segment;
  reader_20.builder.ptr = local_490.ptr;
  reader_20.builder.elementCount = local_490.elementCount;
  reader_20.builder.step = local_490.step;
  reader_20.builder.structDataSize = local_490.structDataSize;
  reader_20.builder.structPointerCount = local_490.structPointerCount;
  reader_20.builder.elementSize = local_490.elementSize;
  reader_20.builder._39_1_ = local_490._39_1_;
  expected_31._M_len = 3;
  expected_31._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_20,expected_31);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_4b8,(PointerBuilder *)&local_788,EIGHT_BYTES,(word *)0x0);
  local_788.ptr._0_8_ = (SegmentBuilder *)0x1234567890abcdef;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x234567890abcdef1;
  local_788.ptr.field_1.value.ownFile.content.size_ = 0x34567890abcdef12;
  reader_21.builder.capTable = local_4b8.capTable;
  reader_21.builder.segment = local_4b8.segment;
  reader_21.builder.ptr = local_4b8.ptr;
  reader_21.builder.elementCount = local_4b8.elementCount;
  reader_21.builder.step = local_4b8.step;
  reader_21.builder.structDataSize = local_4b8.structDataSize;
  reader_21.builder.structPointerCount = local_4b8.structPointerCount;
  reader_21.builder.elementSize = local_4b8.elementSize;
  reader_21.builder._39_1_ = local_4b8._39_1_;
  expected_32._M_len = 3;
  expected_32._M_array = (iterator)&local_788;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_21,expected_32);
  local_788.ptr._0_8_ = local_800.segment;
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
  local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
  PointerBuilder::getList(&local_4e0,(PointerBuilder *)&local_788,POINTER,(word *)0x0);
  local_788.ptr._0_8_ = "foo";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x4;
  local_788.ptr.field_1.value.ownFile.content.size_ =
       (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x4;
  local_788.ptr.field_1.value.file = "baz";
  local_788.ptr.field_1._32_8_ = 4;
  reader_22.builder.capTable = local_4e0.capTable;
  reader_22.builder.segment = local_4e0.segment;
  reader_22.builder.ptr = local_4e0.ptr;
  reader_22.builder.elementCount = local_4e0.elementCount;
  reader_22.builder.step = local_4e0.step;
  reader_22.builder.structDataSize = local_4e0.structDataSize;
  reader_22.builder.structPointerCount = local_4e0.structPointerCount;
  reader_22.builder.elementSize = local_4e0.elementSize;
  reader_22.builder._39_1_ = local_4e0._39_1_;
  expected_33._M_len = 3;
  expected_33._M_array = (iterator)&local_788;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_22,expected_33);
  local_7d8.segment = (SegmentBuilder *)0x1234567890abcdef;
  local_7d8.capTable = (CapTableBuilder *)0x234567890abcdef1;
  local_7d8.data = (void *)0x34567890abcdef12;
  local_788.ptr._0_8_ = "foo";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x4;
  local_788.ptr.field_1.value.ownFile.content.size_ =
       (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x4;
  local_788.ptr.field_1.value.file = "baz";
  local_788.ptr.field_1._32_8_ = 4;
  reader_42.reader.structPointerCount = SStack_814;
  reader_42.reader.structDataSize = local_818;
  reader_42.reader.elementSize = EStack_812;
  reader_42.reader._39_1_ = uStack_811;
  reader_42.reader._44_4_ = uStack_80c;
  reader_42.reader.nestingLimit = iStack_810;
  reader_42.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_42.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_42.reader.ptr = (byte *)local_838._16_8_;
  reader_42.reader._24_8_ = pWStack_820;
  expectedData_05._M_len = 3;
  expectedData_05._M_array = (iterator)&local_7d8;
  expectedPointers_05._M_len = 3;
  expectedPointers_05._M_array = (iterator)&local_788;
  sVar5 = 3;
  checkList(reader_42,expectedData_05,expectedPointers_05);
  local_7d8.segment = (SegmentBuilder *)0x1234567890abcdef;
  local_7d8.capTable = (CapTableBuilder *)0x234567890abcdef1;
  local_7d8.data = (void *)0x34567890abcdef12;
  local_788.ptr._0_8_ = "foo";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x4;
  local_788.ptr.field_1.value.ownFile.content.size_ =
       (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x4;
  local_788.ptr.field_1.value.file = "baz";
  local_788.ptr.field_1._32_8_ = 4;
  root_06._builder.capTable = local_800.capTable;
  root_06._builder.segment = local_800.segment;
  root_06._builder.data = local_800.data;
  root_06._builder.pointers = local_800.pointers;
  root_06._builder.dataSize = local_800.dataSize;
  root_06._builder.pointerCount = local_800.pointerCount;
  root_06._builder._38_2_ = local_800._38_2_;
  expectedData_06._M_len = 3;
  expectedData_06._M_array = (iterator)&local_7d8;
  expectedPointers_06._M_len = sVar5;
  expectedPointers_06._M_array = (iterator)&local_788;
  checkUpgradedList(root_06,expectedData_06,expectedPointers_06);
  local_7d8.segment = (SegmentBuilder *)0x0;
  local_7d8.capTable = (CapTableBuilder *)0x0;
  local_7d8.data = (void *)0x0;
  local_788.ptr._0_8_ = "";
  local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1;
  local_788.ptr.field_1.value.ownFile.content.size_ = (long)"\n\n" + 2;
  local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x1;
  local_788.ptr.field_1.value.file = "";
  local_788.ptr.field_1._32_8_ = 1;
  reader_43.reader.structPointerCount = SStack_814;
  reader_43.reader.structDataSize = local_818;
  reader_43.reader.elementSize = EStack_812;
  reader_43.reader._39_1_ = uStack_811;
  reader_43.reader._44_4_ = uStack_80c;
  reader_43.reader.nestingLimit = iStack_810;
  reader_43.reader.capTable = (CapTableReader *)local_838._8_8_;
  reader_43.reader.segment = (SegmentReader *)local_838._0_8_;
  reader_43.reader.ptr = (byte *)local_838._16_8_;
  reader_43.reader._24_8_ = pWStack_820;
  expectedData_07._M_len = 3;
  expectedData_07._M_array = (iterator)&local_7d8;
  expectedPointers_07._M_len = 3;
  expectedPointers_07._M_array = (iterator)&local_788;
  checkList(reader_43,expectedData_07,expectedPointers_07);
  local_7d8.segment = (SegmentBuilder *)0x4e00380022000c;
  local_838._0_8_ = local_800.segment;
  local_838._8_8_ = local_800.capTable;
  local_838._16_8_ = local_800.pointers;
  PointerBuilder::initList((ListBuilder *)&local_788,(PointerBuilder *)local_838,TWO_BYTES,4);
  uVar6 = 0;
  lVar7 = 0;
  do {
    *(undefined2 *)(local_788.ptr.field_1.value.ownFile.content.size_ + (uVar6 >> 3)) =
         *(undefined2 *)((long)&local_7d8.segment + lVar7);
    lVar7 = lVar7 + 2;
    uVar6 = uVar6 + ((ulong)local_788.ptr.field_1.value.ownFile.content.disposer >> 0x20);
  } while (lVar7 != 8);
  StructBuilder::asReader(&local_800);
  local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
  local_7d8.data = pWStack_820;
  local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
  if (SStack_814 == 0) {
    iStack_810 = 0x7fffffff;
    local_7d8.capTable = (CapTableBuilder *)(CapTableReader *)0x0;
    local_7d8.data = (WirePointer *)0x0;
    local_7d8.segment = (SegmentBuilder *)0x0;
  }
  local_7d8.pointers = (WirePointer *)CONCAT44(local_7d8.pointers._4_4_,iStack_810);
  PointerReader::getList((ListReader *)&local_788,(PointerReader *)&local_7d8,TWO_BYTES,(word *)0x0)
  ;
  local_838._0_8_ = (SegmentBuilder *)0x4e00380022000c;
  reader_44.reader.capTable = (CapTableReader *)local_788.ptr.field_1.value.ownFile.content.ptr;
  reader_44.reader.segment = (SegmentReader *)local_788.ptr._0_8_;
  reader_44.reader.ptr = (byte *)local_788.ptr.field_1.value.ownFile.content.size_;
  reader_44.reader._24_8_ = local_788.ptr.field_1.value.ownFile.content.disposer;
  reader_44.reader._32_8_ = local_788.ptr.field_1.value.file;
  reader_44.reader._40_8_ = local_788.ptr.field_1._32_8_;
  expected_34._M_len = 4;
  expected_34._M_array = (iterator)local_838;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_44,expected_34);
  local_7d8.segment = local_800.segment;
  local_7d8.capTable = local_800.capTable;
  local_7d8.data = local_800.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)local_838,(PointerBuilder *)&local_7d8,(StructSize)0x1,(word *)0x0);
  local_7d8.segment = (SegmentBuilder *)0x0;
  reader_45.reader.capTable = (CapTableReader *)local_788.ptr.field_1.value.ownFile.content.ptr;
  reader_45.reader.segment = (SegmentReader *)local_788.ptr._0_8_;
  reader_45.reader.ptr = (byte *)local_788.ptr.field_1.value.ownFile.content.size_;
  reader_45.reader._24_8_ = local_788.ptr.field_1.value.ownFile.content.disposer;
  reader_45.reader._32_8_ = local_788.ptr.field_1.value.file;
  reader_45.reader._40_8_ = local_788.ptr.field_1._32_8_;
  expected_35._M_len = 4;
  expected_35._M_array = (iterator)&local_7d8;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_45,expected_35);
  if ((ListElementCount)pWStack_820 == 4) {
    ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,0);
    if ((((WireValue<uint32_t> *)local_7d8.data)->value != 0xc) && (kj::_::Debug::minSeverity < 3))
    {
      local_7a8._0_4_ = 0xc;
      ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,0);
      local_78c = ((WireValue<uint32_t> *)local_7d8.data)->value;
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4eb,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
                 (char (*) [40])"failed: expected (12u) == (l[0].getF())",(uint *)&local_7a8,
                 &local_78c);
    }
    ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,1);
    if ((((WireValue<uint32_t> *)local_7d8.data)->value != 0x22) && (kj::_::Debug::minSeverity < 3))
    {
      local_7a8._0_4_ = 0x22;
      ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,1);
      local_78c = ((WireValue<uint32_t> *)local_7d8.data)->value;
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4ec,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
                 (char (*) [40])"failed: expected (34u) == (l[1].getF())",(uint *)&local_7a8,
                 &local_78c);
    }
    ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,2);
    if ((((WireValue<uint32_t> *)local_7d8.data)->value != 0x38) && (kj::_::Debug::minSeverity < 3))
    {
      local_7a8._0_4_ = 0x38;
      ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,2);
      local_78c = ((WireValue<uint32_t> *)local_7d8.data)->value;
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4ed,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
                 (char (*) [40])"failed: expected (56u) == (l[2].getF())",(uint *)&local_7a8,
                 &local_78c);
    }
    ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,3);
    if ((((WireValue<uint32_t> *)local_7d8.data)->value != 0x4e) && (kj::_::Debug::minSeverity < 3))
    {
      local_7a8._0_4_ = 0x4e;
      ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,3);
      local_78c = ((WireValue<uint32_t> *)local_7d8.data)->value;
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4ee,ERROR,"\"failed: expected \" \"(78u) == (l[3].getF())\", 78u, l[3].getF()",
                 (char (*) [40])"failed: expected (78u) == (l[3].getF())",(uint *)&local_7a8,
                 &local_78c);
    }
    ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,0);
    ((WireValue<uint32_t> *)local_7d8.data)->value = 0x65ac1235;
    ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,1);
    ((WireValue<uint32_t> *)local_7d8.data)->value = 0x13f12879;
    ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,2);
    ((WireValue<uint32_t> *)local_7d8.data)->value = 0x33423082;
    ListBuilder::getStructElement(&local_7d8,(ListBuilder *)local_838,3);
    ((WireValue<uint32_t> *)local_7d8.data)->value = 0x12988948;
    local_838._0_8_ = &PTR_run_00372e90;
    local_838._8_8_ = &local_800;
    kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
    if ((Void)local_788.ptr.isSet == (Void)0x1) {
      kj::Exception::~Exception(&local_788.ptr.field_1.value);
    }
    else if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4f4,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
    }
    local_788.ptr._0_8_ = local_800.segment;
    local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
    local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
    PointerBuilder::getList(&local_508,(PointerBuilder *)&local_788,BYTE,(word *)0x0);
    local_788.ptr._0_4_ = 0x48827935;
    reader_23.builder.capTable = local_508.capTable;
    reader_23.builder.segment = local_508.segment;
    reader_23.builder.ptr = local_508.ptr;
    reader_23.builder.elementCount = local_508.elementCount;
    reader_23.builder.step = local_508.step;
    reader_23.builder.structDataSize = local_508.structDataSize;
    reader_23.builder.structPointerCount = local_508.structPointerCount;
    reader_23.builder.elementSize = local_508.elementSize;
    reader_23.builder._39_1_ = local_508._39_1_;
    expected_36._M_len = 4;
    expected_36._M_array = (iterator)&local_788;
    checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
              (reader_23,expected_36);
    local_788.ptr._0_8_ = local_800.segment;
    local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
    local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
    PointerBuilder::getList(&local_530,(PointerBuilder *)&local_788,TWO_BYTES,(word *)0x0);
    local_788.ptr._0_8_ = (SegmentBuilder *)0x8948308228791235;
    reader_24.builder.capTable = local_530.capTable;
    reader_24.builder.segment = local_530.segment;
    reader_24.builder.ptr = local_530.ptr;
    reader_24.builder.elementCount = local_530.elementCount;
    reader_24.builder.step = local_530.step;
    reader_24.builder.structDataSize = local_530.structDataSize;
    reader_24.builder.structPointerCount = local_530.structPointerCount;
    reader_24.builder.elementSize = local_530.elementSize;
    reader_24.builder._39_1_ = local_530._39_1_;
    expected_37._M_len = 4;
    expected_37._M_array = (iterator)&local_788;
    checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
              (reader_24,expected_37);
    local_788.ptr._0_8_ = local_800.segment;
    local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
    local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
    PointerBuilder::getList(&local_558,(PointerBuilder *)&local_788,FOUR_BYTES,(word *)0x0);
    local_788.ptr._0_8_ = (SegmentBuilder *)0x13f1287965ac1235;
    local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x1298894833423082;
    reader_25.builder.capTable = local_558.capTable;
    reader_25.builder.segment = local_558.segment;
    reader_25.builder.ptr = local_558.ptr;
    reader_25.builder.elementCount = local_558.elementCount;
    reader_25.builder.step = local_558.step;
    reader_25.builder.structDataSize = local_558.structDataSize;
    reader_25.builder.structPointerCount = local_558.structPointerCount;
    reader_25.builder.elementSize = local_558.elementSize;
    reader_25.builder._39_1_ = local_558._39_1_;
    expected_38._M_len = 4;
    expected_38._M_array = (iterator)&local_788;
    checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
              (reader_25,expected_38);
    local_788.ptr._0_8_ = local_800.segment;
    local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
    local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
    PointerBuilder::getList(&local_580,(PointerBuilder *)&local_788,EIGHT_BYTES,(word *)0x0);
    local_788.ptr.field_1.value.ownFile.content.size_ = 0x33423082;
    local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x12988948;
    local_788.ptr._0_8_ = (SegmentBuilder *)0x65ac1235;
    local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x13f12879;
    reader_26.builder.capTable = local_580.capTable;
    reader_26.builder.segment = local_580.segment;
    reader_26.builder.ptr = local_580.ptr;
    reader_26.builder.elementCount = local_580.elementCount;
    reader_26.builder.step = local_580.step;
    reader_26.builder.structDataSize = local_580.structDataSize;
    reader_26.builder.structPointerCount = local_580.structPointerCount;
    reader_26.builder.elementSize = local_580.elementSize;
    reader_26.builder._39_1_ = local_580._39_1_;
    expected_39._M_len = 4;
    expected_39._M_array = (iterator)&local_788;
    checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
              (reader_26,expected_39);
    local_838._0_8_ = &PTR_run_00372ec0;
    local_838._8_8_ = &local_800;
    kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
    if ((Void)local_788.ptr.isSet == (Void)0x1) {
      kj::Exception::~Exception(&local_788.ptr.field_1.value);
    }
    else if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4fb,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                );
    }
    local_838._0_8_ = local_800.segment;
    local_838._8_8_ = local_800.capTable;
    local_838._16_8_ = local_800.pointers;
    PointerBuilder::initList((ListBuilder *)&local_788,(PointerBuilder *)local_838,VOID,4);
    local_838._0_8_ = local_800.segment;
    local_838._8_8_ = local_800.capTable;
    local_838._16_8_ = local_800.pointers;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_788,(PointerBuilder *)local_838,(StructSize)0x1,(word *)0x0);
    if (local_788.ptr.field_1._16_4_ == 4) {
      ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,0);
      if (((short)((WireValue<uint32_t> *)local_838._16_8_)->value != 0) &&
         (kj::_::Debug::minSeverity < 3)) {
        local_7d8.segment = (SegmentBuilder *)((ulong)local_7d8.segment & 0xffffffff00000000);
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,0);
        local_7a8._0_2_ = (short)((WireValue<uint32_t> *)local_838._16_8_)->value;
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x502,ERROR,"\"failed: expected \" \"(0u) == (l[0].getF())\", 0u, l[0].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[0].getF())",(uint *)&local_7d8,
                   (unsigned_short *)&local_7a8);
      }
      ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,1);
      if (((short)((WireValue<uint32_t> *)local_838._16_8_)->value != 0) &&
         (kj::_::Debug::minSeverity < 3)) {
        local_7d8.segment = (SegmentBuilder *)((ulong)local_7d8.segment & 0xffffffff00000000);
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,1);
        local_7a8._0_2_ = (short)((WireValue<uint32_t> *)local_838._16_8_)->value;
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x503,ERROR,"\"failed: expected \" \"(0u) == (l[1].getF())\", 0u, l[1].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[1].getF())",(uint *)&local_7d8,
                   (unsigned_short *)&local_7a8);
      }
      ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,2);
      if (((short)((WireValue<uint32_t> *)local_838._16_8_)->value != 0) &&
         (kj::_::Debug::minSeverity < 3)) {
        local_7d8.segment = (SegmentBuilder *)((ulong)local_7d8.segment & 0xffffffff00000000);
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,2);
        local_7a8._0_2_ = (short)((WireValue<uint32_t> *)local_838._16_8_)->value;
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x504,ERROR,"\"failed: expected \" \"(0u) == (l[2].getF())\", 0u, l[2].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[2].getF())",(uint *)&local_7d8,
                   (unsigned_short *)&local_7a8);
      }
      ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,3);
      if (((short)((WireValue<uint32_t> *)local_838._16_8_)->value != 0) &&
         (kj::_::Debug::minSeverity < 3)) {
        local_7d8.segment = (SegmentBuilder *)((ulong)local_7d8.segment & 0xffffffff00000000);
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,3);
        local_7a8._0_2_ = (short)((WireValue<uint32_t> *)local_838._16_8_)->value;
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x505,ERROR,"\"failed: expected \" \"(0u) == (l[3].getF())\", 0u, l[3].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[3].getF())",(uint *)&local_7d8,
                   (unsigned_short *)&local_7a8);
      }
      ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,0);
      *(undefined2 *)&((WireValue<uint32_t> *)local_838._16_8_)->value = 0x311d;
      ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,1);
      *(undefined2 *)&((WireValue<uint32_t> *)local_838._16_8_)->value = 0xcb3;
      ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,2);
      *(undefined2 *)&((WireValue<uint32_t> *)local_838._16_8_)->value = 0x2416;
      ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,3);
      *(undefined2 *)&((WireValue<uint32_t> *)local_838._16_8_)->value = 0x16c8;
      local_838._0_8_ = &PTR_run_00372ef0;
      local_838._8_8_ = &local_800;
      kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
      if ((Void)local_788.ptr.isSet == (Void)0x1) {
        kj::Exception::~Exception(&local_788.ptr.field_1.value);
      }
      else if (kj::_::Debug::minSeverity < 3) {
        kj::_::Debug::log<char_const(&)[112]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x50b,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                   ,(char (*) [112])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                  );
      }
      local_788.ptr._0_8_ = local_800.segment;
      local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
      local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
      PointerBuilder::getList(&local_5a8,(PointerBuilder *)&local_788,TWO_BYTES,(word *)0x0);
      local_788.ptr._0_8_ = (SegmentBuilder *)0x16c824160cb3311d;
      reader_27.builder.capTable = local_5a8.capTable;
      reader_27.builder.segment = local_5a8.segment;
      reader_27.builder.ptr = local_5a8.ptr;
      reader_27.builder.elementCount = local_5a8.elementCount;
      reader_27.builder.step = local_5a8.step;
      reader_27.builder.structDataSize = local_5a8.structDataSize;
      reader_27.builder.structPointerCount = local_5a8.structPointerCount;
      reader_27.builder.elementSize = local_5a8.elementSize;
      reader_27.builder._39_1_ = local_5a8._39_1_;
      expected_40._M_len = 4;
      expected_40._M_array = (iterator)&local_788;
      checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
                (reader_27,expected_40);
      local_788.ptr._0_8_ = local_800.segment;
      local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
      local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
      PointerBuilder::getList(&local_5d0,(PointerBuilder *)&local_788,FOUR_BYTES,(word *)0x0);
      local_788.ptr._0_8_ = (SegmentBuilder *)0xcb30000311d;
      local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x16c800002416;
      reader_28.builder.capTable = local_5d0.capTable;
      reader_28.builder.segment = local_5d0.segment;
      reader_28.builder.ptr = local_5d0.ptr;
      reader_28.builder.elementCount = local_5d0.elementCount;
      reader_28.builder.step = local_5d0.step;
      reader_28.builder.structDataSize = local_5d0.structDataSize;
      reader_28.builder.structPointerCount = local_5d0.structPointerCount;
      reader_28.builder.elementSize = local_5d0.elementSize;
      reader_28.builder._39_1_ = local_5d0._39_1_;
      expected_41._M_len = 4;
      expected_41._M_array = (iterator)&local_788;
      checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
                (reader_28,expected_41);
      local_788.ptr._0_8_ = local_800.segment;
      local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
      local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
      PointerBuilder::getList(&local_5f8,(PointerBuilder *)&local_788,EIGHT_BYTES,(word *)0x0);
      local_788.ptr.field_1.value.ownFile.content.size_ = 0x2416;
      local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x16c8;
      local_788.ptr._0_8_ = (SegmentBuilder *)0x311d;
      local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0xcb3;
      reader_29.builder.capTable = local_5f8.capTable;
      reader_29.builder.segment = local_5f8.segment;
      reader_29.builder.ptr = local_5f8.ptr;
      reader_29.builder.elementCount = local_5f8.elementCount;
      reader_29.builder.step = local_5f8.step;
      reader_29.builder.structDataSize = local_5f8.structDataSize;
      reader_29.builder.structPointerCount = local_5f8.structPointerCount;
      reader_29.builder.elementSize = local_5f8.elementSize;
      reader_29.builder._39_1_ = local_5f8._39_1_;
      expected_42._M_len = 4;
      expected_42._M_array = (iterator)&local_788;
      checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
                (reader_29,expected_42);
      local_838._0_8_ = &PTR_run_00372f20;
      local_838._8_8_ = &local_800;
      kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
      if ((Void)local_788.ptr.isSet == (Void)0x1) {
        kj::Exception::~Exception(&local_788.ptr.field_1.value);
      }
      else if (kj::_::Debug::minSeverity < 3) {
        kj::_::Debug::log<char_const(&)[112]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x50f,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                   ,(char (*) [112])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                  );
      }
      local_838._0_8_ = local_800.segment;
      local_838._8_8_ = local_800.capTable;
      local_838._16_8_ = local_800.pointers;
      PointerBuilder::initList((ListBuilder *)&local_788,(PointerBuilder *)local_838,VOID,4);
      local_838._0_8_ = local_800.segment;
      local_838._8_8_ = local_800.capTable;
      local_838._16_8_ = local_800.pointers;
      PointerBuilder::getStructList
                ((ListBuilder *)&local_788,(PointerBuilder *)local_838,(StructSize)0x10000,
                 (word *)0x0);
      if (local_788.ptr.field_1._16_4_ == 4) {
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,0);
        local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
        local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
        local_7d8.data = pWStack_820;
        PointerBuilder::getBlob<capnp::Text>(&local_7a8,(PointerBuilder *)&local_7d8,(void *)0x0,0);
        if (((local_7a8.content.size_ != 1) ||
            (iVar3 = bcmp(local_7a8.content.ptr,"",0), iVar3 != 0)) &&
           (kj::_::Debug::minSeverity < 3)) {
          ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,0);
          local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
          local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
          local_7d8.data = pWStack_820;
          PointerBuilder::getBlob<capnp::Text>
                    (&local_7a8,(PointerBuilder *)&local_7d8,(void *)0x0,0);
          kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x516,ERROR,
                     "\"failed: expected \" \"(\\\"\\\") == (l[0].getF())\", \"\", l[0].getF()",
                     (char (*) [39])"failed: expected (\"\") == (l[0].getF())",
                     (char (*) [1])0x324321,&local_7a8);
        }
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,1);
        local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
        local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
        local_7d8.data = pWStack_820;
        PointerBuilder::getBlob<capnp::Text>(&local_7a8,(PointerBuilder *)&local_7d8,(void *)0x0,0);
        if (((local_7a8.content.size_ != 1) ||
            (iVar3 = bcmp(local_7a8.content.ptr,"",0), iVar3 != 0)) &&
           (kj::_::Debug::minSeverity < 3)) {
          ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,1);
          local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
          local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
          local_7d8.data = pWStack_820;
          PointerBuilder::getBlob<capnp::Text>
                    (&local_7a8,(PointerBuilder *)&local_7d8,(void *)0x0,0);
          kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x517,ERROR,
                     "\"failed: expected \" \"(\\\"\\\") == (l[1].getF())\", \"\", l[1].getF()",
                     (char (*) [39])"failed: expected (\"\") == (l[1].getF())",
                     (char (*) [1])0x324321,&local_7a8);
        }
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,2);
        local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
        local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
        local_7d8.data = pWStack_820;
        PointerBuilder::getBlob<capnp::Text>(&local_7a8,(PointerBuilder *)&local_7d8,(void *)0x0,0);
        if (((local_7a8.content.size_ != 1) ||
            (iVar3 = bcmp(local_7a8.content.ptr,"",0), iVar3 != 0)) &&
           (kj::_::Debug::minSeverity < 3)) {
          ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,2);
          local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
          local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
          local_7d8.data = pWStack_820;
          PointerBuilder::getBlob<capnp::Text>
                    (&local_7a8,(PointerBuilder *)&local_7d8,(void *)0x0,0);
          kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x518,ERROR,
                     "\"failed: expected \" \"(\\\"\\\") == (l[2].getF())\", \"\", l[2].getF()",
                     (char (*) [39])"failed: expected (\"\") == (l[2].getF())",
                     (char (*) [1])0x324321,&local_7a8);
        }
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,3);
        local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
        local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
        local_7d8.data = pWStack_820;
        PointerBuilder::getBlob<capnp::Text>(&local_7a8,(PointerBuilder *)&local_7d8,(void *)0x0,0);
        if (((local_7a8.content.size_ != 1) ||
            (iVar3 = bcmp(local_7a8.content.ptr,"",0), iVar3 != 0)) &&
           (kj::_::Debug::minSeverity < 3)) {
          ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,3);
          local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
          local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
          local_7d8.data = pWStack_820;
          PointerBuilder::getBlob<capnp::Text>
                    (&local_7a8,(PointerBuilder *)&local_7d8,(void *)0x0,0);
          kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x519,ERROR,
                     "\"failed: expected \" \"(\\\"\\\") == (l[3].getF())\", \"\", l[3].getF()",
                     (char (*) [39])"failed: expected (\"\") == (l[3].getF())",
                     (char (*) [1])0x324321,&local_7a8);
        }
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,0);
        local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
        local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
        local_7d8.data = pWStack_820;
        value_02.super_StringPtr.content.size_ = 4;
        value_02.super_StringPtr.content.ptr = "foo";
        PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_7d8,value_02);
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,1);
        local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
        local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
        local_7d8.data = pWStack_820;
        value_03.super_StringPtr.content.size_ = 4;
        value_03.super_StringPtr.content.ptr = "bar";
        PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_7d8,value_03);
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,2);
        local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
        local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
        local_7d8.data = pWStack_820;
        value_04.super_StringPtr.content.size_ = 4;
        value_04.super_StringPtr.content.ptr = "baz";
        PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_7d8,value_04);
        ListBuilder::getStructElement((StructBuilder *)local_838,(ListBuilder *)&local_788,3);
        local_7d8.segment = (SegmentBuilder *)local_838._0_8_;
        local_7d8.capTable = (CapTableBuilder *)local_838._8_8_;
        local_7d8.data = pWStack_820;
        value_05.super_StringPtr.content.size_ = 4;
        value_05.super_StringPtr.content.ptr = "qux";
        PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_7d8,value_05);
        local_838._0_8_ = &PTR_run_00372f50;
        local_838._8_8_ = &local_800;
        kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
        if ((Void)local_788.ptr.isSet == (Void)0x1) {
          kj::Exception::~Exception(&local_788.ptr.field_1.value);
        }
        else if (kj::_::Debug::minSeverity < 3) {
          kj::_::Debug::log<char_const(&)[112]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x51f,ERROR,
                     "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                     ,(char (*) [112])
                      "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                    );
        }
        local_838._0_8_ = &PTR_run_00372f80;
        local_838._8_8_ = &local_800;
        kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
        if ((Void)local_788.ptr.isSet == (Void)0x1) {
          kj::Exception::~Exception(&local_788.ptr.field_1.value);
        }
        else if (kj::_::Debug::minSeverity < 3) {
          kj::_::Debug::log<char_const(&)[116]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x520,ERROR,
                     "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
                     ,(char (*) [116])
                      "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
                    );
        }
        local_838._0_8_ = &PTR_run_00372fb0;
        local_838._8_8_ = &local_800;
        kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
        if ((Void)local_788.ptr.isSet == (Void)0x1) {
          kj::Exception::~Exception(&local_788.ptr.field_1.value);
        }
        else if (kj::_::Debug::minSeverity < 3) {
          kj::_::Debug::log<char_const(&)[116]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x521,ERROR,
                     "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
                     ,(char (*) [116])
                      "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
                    );
        }
        local_838._0_8_ = &PTR_run_00372fe0;
        local_838._8_8_ = &local_800;
        kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
        if ((Void)local_788.ptr.isSet == (Void)0x1) {
          kj::Exception::~Exception(&local_788.ptr.field_1.value);
        }
        else if (kj::_::Debug::minSeverity < 3) {
          kj::_::Debug::log<char_const(&)[116]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x522,ERROR,
                     "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
                     ,(char (*) [116])
                      "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
                    );
        }
        local_788.ptr._0_8_ = local_800.segment;
        local_788.ptr.field_1.value.ownFile.content.ptr = (char *)local_800.capTable;
        local_788.ptr.field_1.value.ownFile.content.size_ = (size_t)local_800.pointers;
        PointerBuilder::getList(&local_620,(PointerBuilder *)&local_788,POINTER,(word *)0x0);
        local_788.ptr._0_8_ = "foo";
        local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x4;
        local_788.ptr.field_1.value.ownFile.content.size_ =
             (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31;
        local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x4;
        local_788.ptr.field_1.value.file = "baz";
        local_788.ptr.field_1._32_8_ = 4;
        local_788.ptr.field_1.value.description.content.ptr = "qux";
        local_788.ptr.field_1.value.description.content.size_ = 4;
        reader_30.builder.capTable = local_620.capTable;
        reader_30.builder.segment = local_620.segment;
        reader_30.builder.ptr = local_620.ptr;
        reader_30.builder.elementCount = local_620.elementCount;
        reader_30.builder.step = local_620.step;
        reader_30.builder.structDataSize = local_620.structDataSize;
        reader_30.builder.structPointerCount = local_620.structPointerCount;
        reader_30.builder.elementSize = local_620.elementSize;
        reader_30.builder._39_1_ = local_620._39_1_;
        expected_43._M_len = 4;
        expected_43._M_array = (iterator)&local_788;
        checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
                  (reader_30,expected_43);
        local_838._0_8_ = local_800.segment;
        local_838._8_8_ = local_800.capTable;
        local_838._16_8_ = local_800.pointers;
        local_788.ptr._0_8_ = "foo";
        local_788.ptr.field_1.value.ownFile.content.ptr = (char *)0x4;
        local_788.ptr.field_1.value.ownFile.content.size_ =
             (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31;
        local_788.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x4;
        local_788.ptr.field_1.value.file = "baz";
        local_788.ptr.field_1._32_8_ = 4;
        local_788.ptr.field_1.value.description.content.ptr = "qux";
        local_788.ptr.field_1.value.description.content.size_ = 4;
        builder_02.capTable = local_800.capTable;
        builder_02.segment = local_800.segment;
        builder_02.pointer = local_800.pointers;
        value_08.size_ = 4;
        value_08.ptr = (Reader *)&local_788;
        PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set
                  (builder_02,value_08);
        local_838._0_8_ = &PTR_run_00373010;
        local_838._8_8_ = &local_800;
        kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
        if ((Void)local_788.ptr.isSet == (Void)0x1) {
          kj::Exception::~Exception(&local_788.ptr.field_1.value);
        }
        else if (kj::_::Debug::minSeverity < 3) {
          kj::_::Debug::log<char_const(&)[116]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x528,ERROR,
                     "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
                     ,(char (*) [116])
                      "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
                    );
        }
        local_7d8.segment = (SegmentBuilder *)0x220000000c;
        local_7d8.capTable = (CapTableBuilder *)0x4e00000038;
        local_838._0_8_ = local_800.segment;
        local_838._8_8_ = local_800.capTable;
        local_838._16_8_ = local_800.pointers;
        PointerBuilder::initList((ListBuilder *)&local_788,(PointerBuilder *)local_838,FOUR_BYTES,4)
        ;
        uVar6 = 0;
        lVar7 = 0;
        do {
          *(undefined4 *)(local_788.ptr.field_1.value.ownFile.content.size_ + (uVar6 >> 3)) =
               *(undefined4 *)((long)&local_7d8.segment + lVar7);
          lVar7 = lVar7 + 4;
          uVar6 = uVar6 + ((ulong)local_788.ptr.field_1.value.ownFile.content.disposer >> 0x20);
        } while (lVar7 != 0x10);
        local_838._0_8_ = &PTR_run_00373040;
        local_838._8_8_ = &local_800;
        kj::_::runCatchingExceptions(&local_788,(Runnable *)local_838);
        if ((Void)local_788.ptr.isSet == (Void)0x1) {
          kj::Exception::~Exception(&local_788.ptr.field_1.value);
        }
        else if (kj::_::Debug::minSeverity < 3) {
          kj::_::Debug::log<char_const(&)[112]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                     ,0x52a,ERROR,
                     "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                     ,(char (*) [112])
                      "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                    );
        }
        MallocMessageBuilder::~MallocMessageBuilder(&local_120);
        return;
      }
      local_7d8.segment = (SegmentBuilder *)CONCAT44(local_7d8.segment._4_4_,4);
      local_7a8._0_4_ = local_788.ptr.field_1._16_4_;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                ((Fault *)local_838,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x515,FAILED,"(4u) == (l.size())","4u, l.size()",(uint *)&local_7d8,
                 (uint *)&local_7a8);
      kj::_::Debug::Fault::fatal((Fault *)local_838);
    }
    local_7d8.segment = (SegmentBuilder *)CONCAT44(local_7d8.segment._4_4_,4);
    local_7a8._0_4_ = local_788.ptr.field_1._16_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)local_838,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x501,FAILED,"(4u) == (l.size())","4u, l.size()",(uint *)&local_7d8,
               (uint *)&local_7a8);
    kj::_::Debug::Fault::fatal((Fault *)local_838);
  }
  local_7a8._0_4_ = 4;
  local_78c = (ListElementCount)pWStack_820;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&local_7d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x4ea,FAILED,"(4u) == (l.size())","4u, l.size()",(uint *)&local_7a8,&local_78c);
  kj::_::Debug::Fault::fatal((Fault *)&local_7d8);
}

Assistant:

TEST(Encoding, UpgradeListInBuilder) {
  // Test every damned list upgrade.

  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  // -----------------------------------------------------------------

  root.getAnyPointerField().setAs<List<Void>>({VOID, VOID, VOID, VOID});
  checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint8_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());
  checkUpgradedList(root, {0, 0, 0, 0}, {"", "", "", ""});

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<bool>>({true, false, true, true});
    auto orig = root.asReader().getAnyPointerField().getAs<List<bool>>();
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Void>>());
    checkList(root.getAnyPointerField().getAs<List<bool>>(), {true, false, true, true});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint8_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {true, false, true, true});

    // Can't upgrade bit lists. (This used to be supported.)
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<test::TestNewVersion>>());
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint8_t>>({0x12, 0x23, 0x33, 0x44});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint8_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x12, 0x23, 0x33, 0x44});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x12, 0x23, 0x33, 0x44});
    checkUpgradedList(root, {0x12, 0x23, 0x33, 0x44}, {"", "", "", ""});
    checkList(orig, {0, 0, 0, 0});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint16_t>>({0x5612, 0x7823, 0xab33, 0xcd44});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint16_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x12, 0x23, 0x33, 0x44});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0x5612, 0x7823, 0xab33, 0xcd44});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x5612, 0x7823, 0xab33, 0xcd44});
    checkUpgradedList(root, {0x5612, 0x7823, 0xab33, 0xcd44}, {"", "", "", ""});
    checkList(orig, {0, 0, 0, 0});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint32_t>>({0x17595612, 0x29347823, 0x5923ab32, 0x1a39cd45});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x12, 0x23, 0x32, 0x45});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0x5612, 0x7823, 0xab32, 0xcd45});
    checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {0x17595612u, 0x29347823u, 0x5923ab32u, 0x1a39cd45u});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x17595612u, 0x29347823u, 0x5923ab32u, 0x1a39cd45u});
    checkUpgradedList(root, {0x17595612, 0x29347823, 0x5923ab32, 0x1a39cd45}, {"", "", "", ""});
    checkList(orig, {0u, 0u, 0u, 0u});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint64_t>>({0x1234abcd8735fe21, 0x7173bc0e1923af36});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint64_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x21, 0x36});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0xfe21, 0xaf36});
    checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {0x8735fe21u, 0x1923af36u});
    checkList(root.getAnyPointerField().getAs<List<uint64_t>>(), {0x1234abcd8735fe21ull, 0x7173bc0e1923af36ull});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x1234abcd8735fe21ull, 0x7173bc0e1923af36ull});
    checkUpgradedList(root, {0x1234abcd8735fe21ull, 0x7173bc0e1923af36ull}, {"", ""});
    checkList(orig, {0u, 0u});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<Text>>({"foo", "bar", "baz"});
    auto orig = root.asReader().getAnyPointerField().getAs<List<Text>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint8_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    checkList(root.getAnyPointerField().getAs<List<Text>>(), {"foo", "bar", "baz"});

    checkList(orig, {"foo", "bar", "baz"});
    checkUpgradedList(root, {0, 0, 0}, {"foo", "bar", "baz"});
    checkList(orig, {"", "", ""});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    {
      auto l = root.getAnyPointerField().initAs<List<test::TestOldVersion>>(3);
      l[0].setOld1(0x1234567890abcdef);
      l[1].setOld1(0x234567890abcdef1);
      l[2].setOld1(0x34567890abcdef12);
      l[0].setOld2("foo");
      l[1].setOld2("bar");
      l[2].setOld2("baz");
    }
    auto orig = root.asReader().getAnyPointerField().getAs<List<test::TestOldVersion>>();

    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0xefu, 0xf1u, 0x12u});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0xcdefu, 0xdef1u, 0xef12u});
    checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {0x90abcdefu, 0x0abcdef1u, 0xabcdef12u});
    checkList(root.getAnyPointerField().getAs<List<uint64_t>>(),
              {0x1234567890abcdefull, 0x234567890abcdef1ull, 0x34567890abcdef12ull});
    checkList(root.getAnyPointerField().getAs<List<Text>>(), {"foo", "bar", "baz"});

    checkList(orig, {0x1234567890abcdefull, 0x234567890abcdef1ull, 0x34567890abcdef12ull},
                    {"foo", "bar", "baz"});
    checkUpgradedList(root, {0x1234567890abcdefull, 0x234567890abcdef1ull, 0x34567890abcdef12ull},
                            {"foo", "bar", "baz"});
    checkList(orig, {0u, 0u, 0u}, {"", "", ""});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------
  // OK, now we've tested upgrading every primitive list to every primitive list, every primitive
  // list to a multi-word struct, and a multi-word struct to every primitive list.  But we haven't
  // tried upgrading primitive lists to sub-word structs.

  // Upgrade from multi-byte, sub-word data.
  root.getAnyPointerField().setAs<List<uint16_t>>({12u, 34u, 56u, 78u});
  {
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint16_t>>();
    checkList(orig, {12u, 34u, 56u, 78u});
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct32>>();
    checkList(orig, {0u, 0u, 0u, 0u});  // old location zero'd during upgrade
    ASSERT_EQ(4u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
    EXPECT_EQ(78u, l[3].getF());
    l[0].setF(0x65ac1235u);
    l[1].setF(0x13f12879u);
    l[2].setF(0x33423082u);
    l[3].setF(0x12988948u);
  }
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x35u, 0x79u, 0x82u, 0x48u});
  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0x1235u, 0x2879u, 0x3082u, 0x8948u});
  checkList(root.getAnyPointerField().getAs<List<uint32_t>>(),
            {0x65ac1235u, 0x13f12879u, 0x33423082u, 0x12988948u});
  checkList(root.getAnyPointerField().getAs<List<uint64_t>>(),
            {0x65ac1235u, 0x13f12879u, 0x33423082u, 0x12988948u});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

  // Upgrade from void -> data struct
  root.getAnyPointerField().setAs<List<Void>>({VOID, VOID, VOID, VOID});
  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct16>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_EQ(0u, l[0].getF());
    EXPECT_EQ(0u, l[1].getF());
    EXPECT_EQ(0u, l[2].getF());
    EXPECT_EQ(0u, l[3].getF());
    l[0].setF(12573);
    l[1].setF(3251);
    l[2].setF(9238);
    l[3].setF(5832);
  }
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {12573u, 3251u, 9238u, 5832u});
  checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {12573u, 3251u, 9238u, 5832u});
  checkList(root.getAnyPointerField().getAs<List<uint64_t>>(), {12573u, 3251u, 9238u, 5832u});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

  // Upgrade from void -> pointer struct
  root.getAnyPointerField().setAs<List<Void>>({VOID, VOID, VOID, VOID});
  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::StructP>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_EQ("", l[0].getF());
    EXPECT_EQ("", l[1].getF());
    EXPECT_EQ("", l[2].getF());
    EXPECT_EQ("", l[3].getF());
    l[0].setF("foo");
    l[1].setF("bar");
    l[2].setF("baz");
    l[3].setF("qux");
  }
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
  checkList(root.getAnyPointerField().getAs<List<Text>>(), {"foo", "bar", "baz", "qux"});

  // Verify that we cannot "side-grade" a pointer list to a data list, or a data list to
  // a pointer struct list.
  root.getAnyPointerField().setAs<List<Text>>({"foo", "bar", "baz", "qux"});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
  root.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56, 78});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());
}